

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gflags_unittest.cc
# Opt level: O0

void __thiscall
gflags::anon_unknown_5::Test_FlagFileTest_ReadFlagsFromString::Test_FlagFileTest_ReadFlagsFromString
          (Test_FlagFileTest_ReadFlagsFromString *this)

{
  value_type local_18;
  Test_FlagFileTest_ReadFlagsFromString *local_10;
  Test_FlagFileTest_ReadFlagsFromString *this_local;
  
  local_18 = Run;
  local_10 = this;
  std::vector<void_(*)(),_std::allocator<void_(*)()>_>::push_back(&g_testlist,&local_18);
  return;
}

Assistant:

TEST(FlagFileTest, ReadFlagsFromString) {
  TestFlagString(
      // Flag string
      "-test_string=continued\n"
      "# some comments are in order\n"
      "# some\n"
      "  # comments\n"
      "#are\n"
      "                  #trickier\n"
      "# than others\n"
      "-test_bool=true\n"
      "     -test_int32=1\n"
      "-test_double=0.0\n",
      // Expected values
      "continued",
      true,
      1,
      0.0);

  TestFlagString(
      // Flag string
      "# let's make sure it can update values\n"
      "-test_string=initial\n"
      "-test_bool=false\n"
      "-test_int32=123\n"
      "-test_double=123.0\n",
      // Expected values
      "initial",
      false,
      123,
      123.0);

  // Test that flags can use dashes instead of underscores.
  TestFlagString(
      // Flag string
      "-test-string=initial\n"
      "--test-bool=false\n"
      "--test-int32=123\n"
      "--test-double=123.0\n",
      // Expected values
      "initial",
      false,
      123,
      123.0);
}